

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prediction_scheme_decoder_factory.h
# Opt level: O0

unique_ptr<draco::PredictionSchemeDecoder<int,_draco::PredictionSchemeNormalOctahedronCanonicalizedDecodingTransform<int>_>,_std::default_delete<draco::PredictionSchemeDecoder<int,_draco::PredictionSchemeNormalOctahedronCanonicalizedDecodingTransform<int>_>_>_>
 __thiscall
draco::MeshPredictionSchemeDecoderFactory<int>::
DispatchFunctor<draco::PredictionSchemeNormalOctahedronCanonicalizedDecodingTransform<int>,_draco::MeshPredictionSchemeData<draco::MeshAttributeCornerTable>,_(draco::PredictionSchemeTransformType)3>
::operator()(DispatchFunctor<draco::PredictionSchemeNormalOctahedronCanonicalizedDecodingTransform<int>,_draco::MeshPredictionSchemeData<draco::MeshAttributeCornerTable>,_(draco::PredictionSchemeTransformType)3>
             *this,PredictionSchemeMethod method,PointAttribute *attribute,
            PredictionSchemeNormalOctahedronCanonicalizedDecodingTransform<int> *transform,
            MeshPredictionSchemeData<draco::MeshAttributeCornerTable> *mesh_data,
            uint16_t bitstream_version)

{
  pointer __p;
  MeshPredictionSchemeGeometricNormalDecoder<int,_draco::PredictionSchemeNormalOctahedronCanonicalizedDecodingTransform<int>,_draco::MeshPredictionSchemeData<draco::MeshAttributeCornerTable>_>
  *in_RCX;
  int in_EDX;
  tuple<draco::PredictionSchemeDecoder<int,_draco::PredictionSchemeNormalOctahedronCanonicalizedDecodingTransform<int>_>_*,_std::default_delete<draco::PredictionSchemeDecoder<int,_draco::PredictionSchemeNormalOctahedronCanonicalizedDecodingTransform<int>_>_>_>
  in_RDI;
  PointAttribute *in_R8;
  PredictionSchemeNormalOctahedronCanonicalizedDecodingTransform<int> *in_R9;
  nullptr_t in_stack_ffffffffffffffa8;
  __uniq_ptr_impl<draco::PredictionSchemeDecoder<int,_draco::PredictionSchemeNormalOctahedronCanonicalizedDecodingTransform<int>_>,_std::default_delete<draco::PredictionSchemeDecoder<int,_draco::PredictionSchemeNormalOctahedronCanonicalizedDecodingTransform<int>_>_>_>
  this_00;
  MeshPredictionSchemeData<draco::MeshAttributeCornerTable> *in_stack_ffffffffffffffc8;
  
  if (in_EDX == 6) {
    this_00._M_t.
    super__Tuple_impl<0UL,_draco::PredictionSchemeDecoder<int,_draco::PredictionSchemeNormalOctahedronCanonicalizedDecodingTransform<int>_>_*,_std::default_delete<draco::PredictionSchemeDecoder<int,_draco::PredictionSchemeNormalOctahedronCanonicalizedDecodingTransform<int>_>_>_>
    .
    super__Head_base<0UL,_draco::PredictionSchemeDecoder<int,_draco::PredictionSchemeNormalOctahedronCanonicalizedDecodingTransform<int>_>_*,_false>
    ._M_head_impl =
         (tuple<draco::PredictionSchemeDecoder<int,_draco::PredictionSchemeNormalOctahedronCanonicalizedDecodingTransform<int>_>_*,_std::default_delete<draco::PredictionSchemeDecoder<int,_draco::PredictionSchemeNormalOctahedronCanonicalizedDecodingTransform<int>_>_>_>
          )(tuple<draco::PredictionSchemeDecoder<int,_draco::PredictionSchemeNormalOctahedronCanonicalizedDecodingTransform<int>_>_*,_std::default_delete<draco::PredictionSchemeDecoder<int,_draco::PredictionSchemeNormalOctahedronCanonicalizedDecodingTransform<int>_>_>_>
            )in_RDI.
             super__Tuple_impl<0UL,_draco::PredictionSchemeDecoder<int,_draco::PredictionSchemeNormalOctahedronCanonicalizedDecodingTransform<int>_>_*,_std::default_delete<draco::PredictionSchemeDecoder<int,_draco::PredictionSchemeNormalOctahedronCanonicalizedDecodingTransform<int>_>_>_>
             .
             super__Head_base<0UL,_draco::PredictionSchemeDecoder<int,_draco::PredictionSchemeNormalOctahedronCanonicalizedDecodingTransform<int>_>_*,_false>
             ._M_head_impl;
    __p = (pointer)operator_new(0xb8);
    MeshPredictionSchemeGeometricNormalDecoder<int,_draco::PredictionSchemeNormalOctahedronCanonicalizedDecodingTransform<int>,_draco::MeshPredictionSchemeData<draco::MeshAttributeCornerTable>_>
    ::MeshPredictionSchemeGeometricNormalDecoder(in_RCX,in_R8,in_R9,in_stack_ffffffffffffffc8);
    std::
    unique_ptr<draco::PredictionSchemeDecoder<int,draco::PredictionSchemeNormalOctahedronCanonicalizedDecodingTransform<int>>,std::default_delete<draco::PredictionSchemeDecoder<int,draco::PredictionSchemeNormalOctahedronCanonicalizedDecodingTransform<int>>>>
    ::
    unique_ptr<std::default_delete<draco::PredictionSchemeDecoder<int,draco::PredictionSchemeNormalOctahedronCanonicalizedDecodingTransform<int>>>,void>
              ((unique_ptr<draco::PredictionSchemeDecoder<int,_draco::PredictionSchemeNormalOctahedronCanonicalizedDecodingTransform<int>_>,_std::default_delete<draco::PredictionSchemeDecoder<int,_draco::PredictionSchemeNormalOctahedronCanonicalizedDecodingTransform<int>_>_>_>
                *)this_00._M_t.
                  super__Tuple_impl<0UL,_draco::PredictionSchemeDecoder<int,_draco::PredictionSchemeNormalOctahedronCanonicalizedDecodingTransform<int>_>_*,_std::default_delete<draco::PredictionSchemeDecoder<int,_draco::PredictionSchemeNormalOctahedronCanonicalizedDecodingTransform<int>_>_>_>
                  .
                  super__Head_base<0UL,_draco::PredictionSchemeDecoder<int,_draco::PredictionSchemeNormalOctahedronCanonicalizedDecodingTransform<int>_>_*,_false>
                  ._M_head_impl,__p);
  }
  else {
    std::
    unique_ptr<draco::PredictionSchemeDecoder<int,draco::PredictionSchemeNormalOctahedronCanonicalizedDecodingTransform<int>>,std::default_delete<draco::PredictionSchemeDecoder<int,draco::PredictionSchemeNormalOctahedronCanonicalizedDecodingTransform<int>>>>
    ::
    unique_ptr<std::default_delete<draco::PredictionSchemeDecoder<int,draco::PredictionSchemeNormalOctahedronCanonicalizedDecodingTransform<int>>>,void>
              ((unique_ptr<draco::PredictionSchemeDecoder<int,_draco::PredictionSchemeNormalOctahedronCanonicalizedDecodingTransform<int>_>,_std::default_delete<draco::PredictionSchemeDecoder<int,_draco::PredictionSchemeNormalOctahedronCanonicalizedDecodingTransform<int>_>_>_>
                *)in_RDI.
                  super__Tuple_impl<0UL,_draco::PredictionSchemeDecoder<int,_draco::PredictionSchemeNormalOctahedronCanonicalizedDecodingTransform<int>_>_*,_std::default_delete<draco::PredictionSchemeDecoder<int,_draco::PredictionSchemeNormalOctahedronCanonicalizedDecodingTransform<int>_>_>_>
                  .
                  super__Head_base<0UL,_draco::PredictionSchemeDecoder<int,_draco::PredictionSchemeNormalOctahedronCanonicalizedDecodingTransform<int>_>_*,_false>
                  ._M_head_impl,in_stack_ffffffffffffffa8);
  }
  return (__uniq_ptr_data<draco::PredictionSchemeDecoder<int,_draco::PredictionSchemeNormalOctahedronCanonicalizedDecodingTransform<int>_>,_std::default_delete<draco::PredictionSchemeDecoder<int,_draco::PredictionSchemeNormalOctahedronCanonicalizedDecodingTransform<int>_>_>,_true,_true>
          )(__uniq_ptr_data<draco::PredictionSchemeDecoder<int,_draco::PredictionSchemeNormalOctahedronCanonicalizedDecodingTransform<int>_>,_std::default_delete<draco::PredictionSchemeDecoder<int,_draco::PredictionSchemeNormalOctahedronCanonicalizedDecodingTransform<int>_>_>,_true,_true>
            )in_RDI.
             super__Tuple_impl<0UL,_draco::PredictionSchemeDecoder<int,_draco::PredictionSchemeNormalOctahedronCanonicalizedDecodingTransform<int>_>_*,_std::default_delete<draco::PredictionSchemeDecoder<int,_draco::PredictionSchemeNormalOctahedronCanonicalizedDecodingTransform<int>_>_>_>
             .
             super__Head_base<0UL,_draco::PredictionSchemeDecoder<int,_draco::PredictionSchemeNormalOctahedronCanonicalizedDecodingTransform<int>_>_*,_false>
             ._M_head_impl;
}

Assistant:

std::unique_ptr<PredictionSchemeDecoder<DataTypeT, TransformT>> operator()(
        PredictionSchemeMethod method, const PointAttribute *attribute,
        const TransformT &transform, const MeshDataT &mesh_data,
        uint16_t bitstream_version) {
      if (method == MESH_PREDICTION_GEOMETRIC_NORMAL) {
        return std::unique_ptr<PredictionSchemeDecoder<DataTypeT, TransformT>>(
            new MeshPredictionSchemeGeometricNormalDecoder<
                DataTypeT, TransformT, MeshDataT>(attribute, transform,
                                                  mesh_data));
      }
      return nullptr;
    }